

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPMapClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPMapClause *this)

{
  ulong uVar1;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  OpenMPMapClauseType local_64;
  OpenMPMapClauseModifier local_60;
  OpenMPMapClauseType type;
  OpenMPMapClauseModifier modifier3;
  OpenMPMapClauseModifier modifier2;
  OpenMPMapClauseModifier modifier1;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPMapClause *local_18;
  OpenMPMapClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPMapClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"map ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&modifier1,"(",(allocator<char> *)((long)&modifier2 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&modifier2 + 3));
  modifier3 = getModifier1(this);
  type = getModifier2(this);
  local_60 = getModifier3(this);
  local_64 = getType(this);
  if (modifier3 == OMPC_MAP_MODIFIER_always) {
    std::__cxx11::string::operator+=((string *)&modifier1,"always");
  }
  else if (modifier3 == OMPC_MAP_MODIFIER_close) {
    std::__cxx11::string::operator+=((string *)&modifier1,"close");
  }
  else if (modifier3 == OMPC_MAP_MODIFIER_mapper) {
    std::__cxx11::string::operator+=((string *)&modifier1,"mapper");
    std::__cxx11::string::operator+=((string *)&modifier1,"(");
    getMapperIdentifier_abi_cxx11_(&local_88,this);
    std::__cxx11::string::operator+=((string *)&modifier1,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::operator+=((string *)&modifier1,")");
  }
  if (type == OMPC_MAP_TYPE_to) {
    std::__cxx11::string::operator+=((string *)&modifier1," always");
  }
  else if (type == OMPC_MAP_TYPE_from) {
    std::__cxx11::string::operator+=((string *)&modifier1," close");
  }
  else if (type == OMPC_MAP_TYPE_tofrom) {
    std::__cxx11::string::operator+=((string *)&modifier1," mapper");
    std::__cxx11::string::operator+=((string *)&modifier1,"(");
    getMapperIdentifier_abi_cxx11_(&local_a8,this);
    std::__cxx11::string::operator+=((string *)&modifier1,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::operator+=((string *)&modifier1,")");
  }
  if (local_60 == OMPC_MAP_MODIFIER_always) {
    std::__cxx11::string::operator+=((string *)&modifier1," always");
  }
  else if (local_60 == OMPC_MAP_MODIFIER_close) {
    std::__cxx11::string::operator+=((string *)&modifier1," close");
  }
  else if (local_60 == OMPC_MAP_MODIFIER_mapper) {
    std::__cxx11::string::operator+=((string *)&modifier1," mapper");
    std::__cxx11::string::operator+=((string *)&modifier1,"(");
    getMapperIdentifier_abi_cxx11_(&local_c8,this);
    std::__cxx11::string::operator+=((string *)&modifier1,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::operator+=((string *)&modifier1,")");
  }
  switch(local_64) {
  case OMPC_MAP_TYPE_to:
    std::__cxx11::string::operator+=((string *)&modifier1," to");
    break;
  case OMPC_MAP_TYPE_from:
    std::__cxx11::string::operator+=((string *)&modifier1," from");
    break;
  case OMPC_MAP_TYPE_tofrom:
    std::__cxx11::string::operator+=((string *)&modifier1," tofrom");
    break;
  case OMPC_MAP_TYPE_alloc:
    std::__cxx11::string::operator+=((string *)&modifier1," alloc");
    break;
  case OMPC_MAP_TYPE_release:
    std::__cxx11::string::operator+=((string *)&modifier1," release");
    break;
  case OMPC_MAP_TYPE_delete:
    std::__cxx11::string::operator+=((string *)&modifier1," delete");
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&modifier1," : ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_e8,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier1,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::operator+=((string *)&modifier1,") ");
  uVar1 = std::__cxx11::string::size();
  if (3 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier1);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier1);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPMapClause::toString() {

    std::string result = "map ";
    std::string clause_string = "(";
    OpenMPMapClauseModifier modifier1 = this->getModifier1();
    OpenMPMapClauseModifier modifier2 = this->getModifier2();
    OpenMPMapClauseModifier modifier3 = this->getModifier3();

    OpenMPMapClauseType type = this->getType();
    switch (modifier1) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += "always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += "close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += "mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
    switch (modifier2) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += " always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += " close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += " mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
    switch (modifier3) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += " always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += " close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += " mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }

    switch (type) {
        case OMPC_MAP_TYPE_to:
            clause_string += " to";
            break;
        case OMPC_MAP_TYPE_from:
            clause_string += " from";
            break;
        case OMPC_MAP_TYPE_tofrom:
            clause_string += " tofrom";
            break;
        case OMPC_MAP_TYPE_alloc:
            clause_string += " alloc";
            break;
        case OMPC_MAP_TYPE_release:
            clause_string += " release";
            break;
        case OMPC_MAP_TYPE_delete:
            clause_string += " delete";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}